

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::child(Tree *this,size_t node,size_t pos)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  size_t sVar5;
  csubstr cVar6;
  char *pcStack_58;
  size_t local_50;
  char msg [29];
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        sVar5 = (*pcVar2)();
        return sVar5;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar6.len;
    pcStack_58 = cVar6.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x677b) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x677b) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  sVar5 = first_child(this,node);
  while( true ) {
    bVar4 = pos == 0;
    pos = pos - 1;
    if ((sVar5 == 0xffffffffffffffff) || (bVar4)) break;
    sVar5 = next_sibling(this,sVar5);
  }
  return sVar5;
}

Assistant:

size_t Tree::child(size_t node, size_t pos) const
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(count++ == pos)
            return i;
    }
    return NONE;
}